

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeDataNeededByPortableTransforms
          (SequentialAttributeDecodersController *this,DecoderBuffer *in_buffer)

{
  int iVar1;
  uint uVar2;
  pointer pSVar3;
  undefined8 in_RSI;
  long *in_RDI;
  int i;
  int32_t num_attributes;
  int local_20;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))();
  local_20 = 0;
  while( true ) {
    if (iVar1 <= local_20) {
      return true;
    }
    std::
    vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                  *)(in_RDI + 9),(long)local_20);
    pSVar3 = std::
             unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           *)0x1de18d);
    uVar2 = (*pSVar3->_vptr_SequentialAttributeDecoder[5])(pSVar3,in_RDI + 0xc,in_RSI);
    if ((uVar2 & 1) == 0) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool SequentialAttributeDecodersController::
    DecodeDataNeededByPortableTransforms(DecoderBuffer *in_buffer) {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    if (!sequential_decoders_[i]->DecodeDataNeededByPortableTransform(
            point_ids_, in_buffer)) {
      return false;
    }
  }
  return true;
}